

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

int32_t BinaryenConstGetValueI64High(BinaryenExpressionRef expr)

{
  bool bVar1;
  int64_t iVar2;
  Expression *expression;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::Const>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xad9,"int32_t BinaryenConstGetValueI64High(BinaryenExpressionRef)");
  }
  iVar2 = wasm::Literal::geti64((Literal *)(expr + 1));
  return (int32_t)((ulong)iVar2 >> 0x20);
}

Assistant:

int32_t BinaryenConstGetValueI64High(BinaryenExpressionRef expr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  return (int32_t)(static_cast<Const*>(expression)->value.geti64() >> 32);
}